

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

TPZFMatrix<Fad<float>_> * __thiscall
TPZFMatrix<Fad<float>_>::operator+
          (TPZFMatrix<Fad<float>_> *__return_storage_ptr__,TPZFMatrix<Fad<float>_> *this,
          Fad<float> *value)

{
  int iVar1;
  uint uVar2;
  float *pfVar3;
  float *pfVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  Fad<float> *pFVar8;
  Fad<float> *pFVar9;
  
  TPZFMatrix(__return_storage_ptr__,this);
  lVar7 = (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fCol *
          (this->super_TPZMatrix<Fad<float>_>).super_TPZBaseMatrix.fRow;
  if (0 < lVar7) {
    pFVar9 = __return_storage_ptr__->fElem;
    pFVar8 = pFVar9 + lVar7;
    do {
      iVar1 = (value->dx_).num_elts;
      lVar7 = (long)iVar1;
      if (lVar7 != 0) {
        uVar2 = (pFVar9->dx_).num_elts;
        pfVar3 = (value->dx_).ptr_to_data;
        if ((ulong)uVar2 == 0) {
          (pFVar9->dx_).num_elts = iVar1;
          uVar6 = lVar7 * 4;
          if (iVar1 < 0) {
            uVar6 = 0xffffffffffffffff;
          }
          pfVar4 = (float *)operator_new__(uVar6);
          (pFVar9->dx_).ptr_to_data = pfVar4;
          if (0 < iVar1) {
            lVar5 = 0;
            do {
              pfVar4[lVar5] = pfVar3[lVar5];
              lVar5 = lVar5 + 1;
            } while (lVar7 != lVar5);
          }
        }
        else if (0 < (int)uVar2) {
          pfVar4 = (pFVar9->dx_).ptr_to_data;
          uVar6 = 0;
          do {
            pfVar4[uVar6] = pfVar3[uVar6] + pfVar4[uVar6];
            uVar6 = uVar6 + 1;
          } while (uVar2 != uVar6);
        }
      }
      pFVar9->val_ = value->val_ + pFVar9->val_;
      pFVar9 = pFVar9 + 1;
    } while (pFVar9 < pFVar8);
  }
  return __return_storage_ptr__;
}

Assistant:

TPZFMatrix<TVar> TPZFMatrix<TVar>::operator+(const TVar value ) const {
    TPZFMatrix<TVar> res( *this );
    int64_t size = ((int64_t)this->Rows()) * this->Cols();
    
    TVar * dst = res.fElem,  *dstlast = dst+size;
    while ( dst < dstlast )
        *dst++ += value;
    
    return( res );
}